

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

uint IlmThread_3_2::ThreadPool::estimateThreadCountForFileIO(void)

{
  uint uVar1;
  long lVar2;
  
  uVar1 = std::thread::hardware_concurrency();
  if ((int)uVar1 < 1) {
    lVar2 = sysconf(0x54);
    uVar1 = (uint)lVar2;
  }
  return uVar1;
}

Assistant:

unsigned
ThreadPool::estimateThreadCountForFileIO ()
{
#ifdef ENABLE_THREADING
    unsigned rv = std::thread::hardware_concurrency ();
    // hardware concurrency is not required to work
    if (rv == 0 ||
        rv > static_cast<unsigned> (std::numeric_limits<int>::max ()))
    {
        rv = 1;
#    if (defined(_WIN32) || defined(_WIN64))
        SYSTEM_INFO si;
        GetNativeSystemInfo (&si);

        rv = si.dwNumberOfProcessors;
#    else
        // linux, bsd, and mac are fine with this
        // other *nix should be too, right?
        rv = sysconf (_SC_NPROCESSORS_ONLN);
#    endif
    }
    return rv;
#else
    return 0;
#endif
}